

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

wchar_t yes(char *fmt,...)

{
  byte bVar1;
  char in_AL;
  ssize_t sVar2;
  ushort **ppuVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  wchar_t wVar4;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  byte *pbVar5;
  ulong uVar6;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char buff [32];
  va_list ap;
  undefined1 local_c8 [8];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  pbVar5 = (byte *)buff;
  ap[0].reg_save_area = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = &stack0x00000008;
  ap[0].gp_offset = 8;
  ap[0].fp_offset = 0x30;
  local_c0 = in_RSI;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  vfprintf(_stderr,fmt,ap);
  fwrite(" (y/N)? ",8,1,_stderr);
  fflush(_stderr);
  sVar2 = read(2,buff,0x1f);
  if (-1 < sVar2) {
    wVar4 = L'\0';
    if (sVar2 != 0) {
      buff[sVar2] = '\0';
      do {
        bVar1 = *pbVar5;
        uVar6 = (ulong)bVar1;
        if (uVar6 == 0) {
          return L'\0';
        }
        ppuVar3 = __ctype_b_loc();
        pbVar5 = pbVar5 + 1;
      } while ((*(byte *)((long)*ppuVar3 + uVar6 * 2 + 1) & 0x20) != 0);
      if ((uVar6 == 0x4e) || ((wVar4 = L'\x01', bVar1 != 0x59 && (bVar1 != 0x79)))) {
        wVar4 = L'\0';
      }
    }
    return wVar4;
  }
  fwrite("Keyboard read failed\n",0x15,1,_stderr);
  exit(1);
}

Assistant:

int
yes(const char *fmt, ...)
{
	char buff[32];
	char *p;
	ssize_t l;
	int read_fd = 2; /* stderr */

	va_list ap;
	va_start(ap, fmt);
	vfprintf(stderr, fmt, ap);
	va_end(ap);
	fprintf(stderr, " (y/N)? ");
	fflush(stderr);

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* To be resilient when stdin is a pipe, bsdtar prefers to read from
	 * stderr.  On Windows, stderr cannot be read. The nearest "piping
	 * resilient" equivalent is reopening the console input handle.
	 */
	read_fd = _open("CONIN$", O_RDONLY);
	if (read_fd < 0) {
	  fprintf(stderr, "Keyboard read failed\n");
	  exit(1);
	}
#endif

	l = read(read_fd, buff, sizeof(buff) - 1);

#if defined(_WIN32) && !defined(__CYGWIN__)
	_close(read_fd);
#endif

	if (l < 0) {
	  fprintf(stderr, "Keyboard read failed\n");
	  exit(1);
	}
	if (l == 0)
		return (0);
	buff[l] = 0;

	for (p = buff; *p != '\0'; p++) {
		if (isspace((unsigned char)*p))
			continue;
		switch(*p) {
		case 'y': case 'Y':
			return (1);
		case 'n': case 'N':
			return (0);
		default:
			return (0);
		}
	}

	return (0);
}